

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void freelev(xchar levnum)

{
  level *lev_00;
  level *lev;
  xchar levnum_local;
  
  lev_00 = levels[levnum];
  free_timers(lev_00);
  free_light_sources(lev_00);
  free_monchn(lev_00->monlist);
  free_worm(lev_00);
  freetrapchn(lev_00->lev_traps);
  free_objchn(lev_00->objlist);
  free_objchn(lev_00->buriedobjlist);
  free_objchn(lev_00->billobjs);
  free_mongen_override(lev_00->mon_gen);
  free_lvl_sounds(lev_00->sounds);
  lev_00->monlist = (monst *)0x0;
  lev_00->lev_traps = (trap *)0x0;
  lev_00->objlist = (obj *)0x0;
  lev_00->buriedobjlist = (obj *)0x0;
  lev_00->billobjs = (obj *)0x0;
  lev_00->mon_gen = (mon_gen_override *)0x0;
  lev_00->sounds = (lvl_sounds *)0x0;
  free_engravings(lev_00);
  freedamage(lev_00);
  free_regions(lev_00);
  free(lev_00);
  levels[levnum] = (level *)0x0;
  return;
}

Assistant:

void freelev(xchar levnum)
{
	struct level *lev = levels[levnum];
	
	/* must be freed before mons, objs, and buried objs */
	free_timers(lev);
	free_light_sources(lev);

	free_monchn(lev->monlist);
	free_worm(lev);
	freetrapchn(lev->lev_traps);
	free_objchn(lev->objlist);
	free_objchn(lev->buriedobjlist);
	free_objchn(lev->billobjs);
	free_mongen_override(lev->mon_gen);
	free_lvl_sounds(lev->sounds);

	lev->monlist = NULL;
	lev->lev_traps = NULL;
	lev->objlist = NULL;
	lev->buriedobjlist = NULL;
	lev->billobjs = NULL;
	lev->mon_gen = NULL;
	lev->sounds = NULL;

	free_engravings(lev);
	freedamage(lev);
	free_regions(lev);
	
	free(lev);
	levels[levnum] = NULL;
}